

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O2

void __thiscall
HighsMatrixSlice<HighsTripletTreeSliceInOrder>::iterator::iterator
          (iterator *this,HighsInt *nodeIndex,double *nodeValue,HighsInt *nodeLeft,
          HighsInt *nodeRight,HighsInt node)

{
  vector<int,_std::allocator<int>_> *this_00;
  HighsInt *__x;
  double **ppdVar1;
  int iVar2;
  int local_24;
  
  (this->pos_).index_ = nodeIndex;
  (this->pos_).value_ = nodeValue;
  this->nodeLeft = nodeLeft;
  this->nodeRight = nodeRight;
  this_00 = &this->stack;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->currentNode = node;
  std::vector<int,_std::allocator<int>_>::reserve(this_00,0x10);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_24);
  __x = &this->currentNode;
  iVar2 = *__x;
  if (iVar2 != -1) {
    while (nodeLeft[iVar2] != -1) {
      std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
      iVar2 = nodeLeft[*__x];
      *__x = iVar2;
    }
    (this->pos_).index_ = (this->pos_).index_ + iVar2;
    ppdVar1 = &(this->pos_).value_;
    *ppdVar1 = *ppdVar1 + iVar2;
  }
  return;
}

Assistant:

iterator(const HighsInt* nodeIndex, const double* nodeValue,
             const HighsInt* nodeLeft, const HighsInt* nodeRight, HighsInt node)
        : pos_(nodeIndex, nodeValue),
          nodeLeft(nodeLeft),
          nodeRight(nodeRight),
          currentNode(node) {
      stack.reserve(16);
      stack.push_back(-1);
      if (currentNode == -1) return;
      while (nodeLeft[currentNode] != -1) {
        stack.push_back(currentNode);
        currentNode = nodeLeft[currentNode];
      }

      pos_.index_ += currentNode;
      pos_.value_ += currentNode;
    }